

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O1

int Sbd_ProblemSolve(Gia_Man_t *p,Vec_Int_t *vMirrors,int Pivot,Vec_Int_t *vWinObjs,
                    Vec_Int_t *vObj2Var,Vec_Int_t *vTfo,Vec_Int_t *vRoots,Vec_Int_t *vDivSet,
                    int nStrs,Sbd_Str_t *pStr0)

{
  bool bVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  sat_solver *pSat;
  sat_solver *s;
  ulong uVar5;
  Sbd_Str_t *pSVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  Vec_Int_t *pVVar14;
  int iLit;
  int pVarsQbf [256];
  int pVarsCec [256];
  int local_89c;
  ulong local_898;
  ulong local_890;
  ulong local_888;
  Vec_Int_t *local_880;
  Vec_Int_t *local_878;
  Vec_Int_t *local_870;
  int local_864;
  ulong local_860;
  Vec_Int_t *local_858;
  int local_84c;
  ulong local_848;
  ulong local_840;
  int local_838 [256];
  timespec local_438 [64];
  
  uVar10 = (ulong)nStrs;
  local_878 = vWinObjs;
  local_858 = vObj2Var;
  clock_gettime(3,local_438);
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(400);
  pVVar14 = local_878;
  pVVar3->pArray = piVar4;
  uVar5 = 0;
  local_880 = vTfo;
  local_870 = pVVar3;
  pSat = Sbd_ManSatSolver((sat_solver *)0x0,p,vMirrors,Pivot,local_878,local_858,vTfo,vRoots,1);
  s = sat_solver_new();
  uVar9 = vDivSet->nSize;
  if (0 < (long)uVar10) {
    uVar5 = 0;
    pSVar6 = pStr0;
    do {
      iVar7 = 1 << ((byte)pSVar6->nVarIns & 0x1f);
      if (pSVar6->fLut == 0) {
        iVar7 = pSVar6->nVarIns;
      }
      uVar5 = (ulong)(uint)((int)uVar5 + iVar7);
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 < pStr0 + uVar10);
  }
  local_898 = uVar10;
  if (10 < (int)uVar9) {
    __assert_fail("Vec_IntSize(vDivSet) <= SBD_DIV_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                  ,0xd6,
                  "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                 );
  }
  local_860 = (ulong)(nStrs + uVar9);
  if (0x100 < (int)(nStrs + uVar9 + (int)uVar5)) {
    __assert_fail("nVars + nStrs + nPars <= 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                  ,0xd7,
                  "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                 );
  }
  iVar7 = pVVar14->nSize;
  local_890 = (ulong)(uint)local_880->nSize;
  iVar2 = vRoots->nSize;
  local_880 = (Vec_Int_t *)(long)(int)uVar9;
  if (0 < (int)uVar9) {
    memcpy(local_438,vDivSet->pArray,(ulong)uVar9 * 4);
  }
  if (0 < (int)local_898) {
    uVar10 = 0;
    do {
      *(int *)((long)&local_438[0].tv_sec + uVar10 * 4 + (long)local_880 * 4) =
           iVar7 + iVar2 + (int)local_890 + (int)uVar10;
      uVar10 = uVar10 + 1;
    } while ((local_898 & 0xffffffff) != uVar10);
  }
  lVar12 = (long)(int)local_860;
  if (0 < (int)uVar5) {
    uVar10 = 0;
    do {
      *(int *)((long)&local_438[0].tv_sec + uVar10 * 4 + lVar12 * 4) =
           (int)local_890 + iVar2 + iVar7 + (int)local_898 + (int)uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  iVar7 = (int)local_890 + iVar7;
  local_888 = uVar5;
  local_858 = (Vec_Int_t *)uVar5;
  if (0 < (int)local_860) {
    memset(local_838,0xff,(ulong)(((int)local_898 + uVar9) - 1) * 4 + 4);
  }
  pVVar14 = local_870;
  uVar8 = iVar7 + iVar2;
  local_890 = (ulong)uVar8;
  if (0 < (int)local_888) {
    uVar10 = 0;
    do {
      local_838[lVar12 + uVar10] = (int)uVar10;
      uVar10 = uVar10 + 1;
    } while (local_858 != (Vec_Int_t *)uVar10);
  }
  iVar7 = (int)local_898;
  uVar8 = uVar8 + iVar7;
  local_878 = (Vec_Int_t *)(ulong)uVar9;
  Sbd_ProblemAddClauses(pSat,(int)local_880,iVar7,(int *)local_438,pStr0);
  sat_solver_setnvars(s,1000);
  Sbd_ProblemAddClausesInit(s,(int)local_878,iVar7,local_838,pStr0);
  pVVar14->nSize = 0;
  if (0 < (int)local_888) {
    iVar7 = uVar8 * 2 + 1;
    uVar10 = local_888 & 0xffffffff;
    uVar9 = uVar8;
    do {
      if ((int)uVar9 < 0) goto LAB_00545312;
      Vec_IntPush(local_870,iVar7);
      iVar7 = iVar7 + 2;
      uVar9 = uVar9 + 1;
      uVar11 = (int)uVar10 - 1;
      uVar10 = (ulong)uVar11;
    } while (uVar11 != 0);
  }
  local_84c = 1 << ((byte)local_878 & 0x1f);
  local_840 = local_890 & 0xffffffff;
  local_878 = (Vec_Int_t *)(ulong)uVar8;
  if (local_84c < 2) {
    local_84c = 1;
  }
  uVar10 = local_860 & 0xffffffff;
  local_848 = (ulong)(uVar8 * 2);
  iVar7 = 0;
  local_864 = (int)local_888;
  pVVar14 = local_870;
  do {
    iVar2 = sat_solver_solve(pSat,pVVar14->pArray,pVVar14->pArray + pVVar14->nSize,0,0,0,0);
    bVar1 = true;
    if (iVar2 != -1) {
      if (iVar2 != 1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                      ,0xf8,
                      "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                     );
      }
      pVVar14->nSize = 0;
      if (0 < (int)local_860) {
        uVar5 = 0;
        do {
          local_838[uVar5] = local_864 + (int)uVar5;
          uVar5 = uVar5 + 1;
        } while (uVar10 != uVar5);
        local_864 = local_864 + (int)uVar5;
      }
      if (0 < vDivSet->nSize) {
        lVar12 = 0;
        do {
          iVar2 = vDivSet->pArray[lVar12];
          if (((long)iVar2 < 0) || (pSat->size <= iVar2)) goto LAB_005452f3;
          if (local_838[lVar12] < 0) goto LAB_00545312;
          local_89c = (uint)(pSat->model[iVar2] != 1) + local_838[lVar12] * 2;
          iVar2 = sat_solver_addclause(s,&local_89c,(lit *)&local_898);
          if (iVar2 == 0) {
            __assert_fail("status",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                          ,0x10b,
                          "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                         );
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < vDivSet->nSize);
      }
      if (((int)local_890 < 0) || (pSat->size <= (int)local_890)) {
LAB_005452f3:
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      if (local_838[(long)local_880] < 0) {
LAB_00545312:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      local_89c = (uint)(pSat->model[local_840] == 1) + local_838[(long)local_880] * 2;
      iVar2 = sat_solver_addclause(s,&local_89c,(lit *)&local_898);
      if (iVar2 == 0) {
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                      ,0x111,
                      "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                     );
      }
      iVar2 = Sbd_ProblemAddClauses(s,(int)local_880,(int)local_898,local_838,pStr0);
      if ((iVar2 == 0) || (iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0), iVar2 == -1))
      {
        bVar1 = true;
      }
      else {
        if (iVar2 != 1) {
          __assert_fail("status == l_True",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                        ,0x11b,
                        "int Sbd_ProblemSolve(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, Sbd_Str_t *)"
                       );
        }
        if (0 < (int)local_888) {
          uVar5 = local_848 & 0xffffffff;
          uVar13 = 0;
          do {
            if ((long)s->size <= (long)uVar13) goto LAB_005452f3;
            if ((int)local_878 + (int)uVar13 < 0) goto LAB_00545312;
            Vec_IntPush(local_870,(uint)(s->model[uVar13] != 1) + (int)uVar5);
            uVar13 = uVar13 + 1;
            uVar5 = (ulong)((int)uVar5 + 2);
          } while (local_858 != (Vec_Int_t *)uVar13);
        }
        bVar1 = false;
        pVVar14 = local_870;
      }
    }
    if ((bVar1) || (iVar7 = iVar7 + 1, iVar7 == local_84c)) {
      bVar1 = 0 < pVVar14->nSize;
      if (bVar1) {
        Sbd_ProblemCollectSolution((int)local_898,pStr0,pVVar14);
      }
      sat_solver_delete(pSat);
      sat_solver_delete(s);
      if (pVVar14->pArray != (int *)0x0) {
        free(pVVar14->pArray);
        pVVar14->pArray = (int *)0x0;
      }
      free(pVVar14);
      return (uint)bVar1;
    }
  } while( true );
}

Assistant:

int Sbd_ProblemSolve( Gia_Man_t * p, Vec_Int_t * vMirrors, 
                       int Pivot, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, 
                       Vec_Int_t * vTfo, Vec_Int_t * vRoots, 
                       Vec_Int_t * vDivSet, int nStrs, Sbd_Str_t * pStr0 )  // divisors, structures
{
    extern sat_solver * Sbd_ManSatSolver( sat_solver * pSat, Gia_Man_t * p, Vec_Int_t * vMirrors, int Pivot, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, Vec_Int_t * vTfo, Vec_Int_t * vRoots, int fQbf );
    
    int fVerbose = 0;
    abctime clk = Abc_Clock();
    Vec_Int_t * vLits    = Vec_IntAlloc( 100 );
    sat_solver * pSatCec = Sbd_ManSatSolver( NULL, p, vMirrors, Pivot, vWinObjs, vObj2Var, vTfo, vRoots, 1 );
    sat_solver * pSatQbf = sat_solver_new();

    int nVars      = Vec_IntSize( vDivSet );
    int nPars      = Sbd_ProblemCountParams( nStrs, pStr0 );

    int VarCecOut  = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots);
    int VarCecPar  = VarCecOut + nStrs;

    int VarQbfPar  = 0;
    int VarQbfFree = nPars;

    int pVarsCec[256];
    int pVarsQbf[256];
    int i, iVar, iLit, nIters;
    int RetValue = 0;

    assert( Vec_IntSize(vDivSet) <= SBD_DIV_MAX );
    assert( nVars + nStrs + nPars <= 256 );

    // collect CEC variables
    Vec_IntForEachEntry( vDivSet, iVar, i )
        pVarsCec[i] = iVar;
    for ( i = 0; i < nStrs; i++ )
        pVarsCec[nVars + i] = VarCecOut + i;
    for ( i = 0; i < nPars; i++ )
        pVarsCec[nVars + nStrs + i] = VarCecPar + i;

    // collect QBF variables
    for ( i = 0; i < nVars + nStrs; i++ )
        pVarsQbf[i] = -1;
    for ( i = 0; i < nPars; i++ )
        pVarsQbf[nVars + nStrs + i] = VarQbfPar + i;

    // add clauses to the CEC problem
    Sbd_ProblemAddClauses( pSatCec, nVars, nStrs, pVarsCec, pStr0 );

    // create QBF solver
    sat_solver_setnvars( pSatQbf, 1000 );
    Sbd_ProblemAddClausesInit( pSatQbf, nVars, nStrs, pVarsQbf, pStr0 );

    // assume all parameter variables are 0
    Vec_IntClear( vLits );
    for ( i = 0; i < nPars; i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(VarCecPar + i, 1) );
    for ( nIters = 0; nIters < (1 << nVars); nIters++ )
    {
        // check if these parameters solve the problem
        int status = sat_solver_solve( pSatCec, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
        if ( status == l_False ) // solution found
            break;
        assert( status == l_True );

        if ( fVerbose )
        {
            printf( "Iter %3d : ", nIters );
            for ( i = 0; i < nPars; i++ )
                printf( "%d", !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) );
            printf( "    " );
        }

        Vec_IntClear( vLits );
        // create new QBF variables
        for ( i = 0; i < nVars + nStrs; i++ )
            pVarsQbf[i] = VarQbfFree++;
        // set their values
        Vec_IntForEachEntry( vDivSet, iVar, i )
        {
            iLit = Abc_Var2Lit( pVarsQbf[i], !sat_solver_var_value(pSatCec, iVar) );
            status = sat_solver_addclause( pSatQbf, &iLit, &iLit + 1 );
            assert( status );
            if ( fVerbose )
                printf( "%d", sat_solver_var_value(pSatCec, iVar) );
        }
        iLit = Abc_Var2Lit( pVarsQbf[nVars], sat_solver_var_value(pSatCec, VarCecOut) );
        status = sat_solver_addclause( pSatQbf, &iLit, &iLit + 1 );
        assert( status );
        if ( fVerbose )
            printf( " %d\n", !sat_solver_var_value(pSatCec, VarCecOut) );
        // add clauses to the QBF problem
        if ( !Sbd_ProblemAddClauses( pSatQbf, nVars, nStrs, pVarsQbf, pStr0 ) )
            break; // solution does not exist
        // check if solution still exists
        status = sat_solver_solve( pSatQbf, NULL, NULL, 0, 0, 0, 0 );
        if ( status == l_False ) // solution does not exist
            break;
        assert( status == l_True ); 
        // find the new values of parameters
        assert( Vec_IntSize(vLits) == 0 );
        for ( i = 0; i < nPars; i++ )
            Vec_IntPush( vLits, Abc_Var2Lit(VarCecPar + i, !sat_solver_var_value(pSatQbf, VarQbfPar + i)) );
    }
    if ( Vec_IntSize(vLits) > 0 )
    {
        //Sbd_ProblemPrintSolution( nStrs, pStr0, vLits );
        Sbd_ProblemCollectSolution( nStrs, pStr0, vLits );
        RetValue = 1;
    }
    sat_solver_delete( pSatCec );
    sat_solver_delete( pSatQbf );
    Vec_IntFree( vLits );

    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return RetValue;
}